

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

PublicPrivateRequiredPair libcellml::publicAndOrPrivateInterfaceTypeRequired(VariablePtr *variable)

{
  bool bVar1;
  PublicPrivateRequiredPair PVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  ParentedEntityPtr componentOfVariable;
  ParentedEntityPtr componentOfEquivalentVariable;
  VariablePtr equivalentVariable;
  
  bVar5 = false;
  bVar4 = false;
  uVar6 = 0;
  do {
    sVar3 = Variable::equivalentVariableCount
                      ((variable->
                       super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    if ((sVar3 <= uVar6) || ((bVar4 & bVar5) != 0)) goto LAB_002121d9;
    Variable::equivalentVariable
              ((Variable *)&equivalentVariable,
               (size_t)(variable->
                       super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    ParentedEntity::parent((ParentedEntity *)&componentOfVariable);
    ParentedEntity::parent((ParentedEntity *)&componentOfEquivalentVariable);
    if (componentOfEquivalentVariable.
        super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      bVar1 = false;
    }
    else {
      bVar1 = areEntitiesSiblings(&componentOfVariable,&componentOfEquivalentVariable);
      if (!bVar1) {
        bVar1 = isEntityChildOf(&componentOfVariable,&componentOfEquivalentVariable);
        if (!bVar1) {
          bVar1 = isEntityChildOf(&componentOfEquivalentVariable,&componentOfVariable);
          if (bVar1) {
            bVar5 = true;
          }
          goto LAB_002121aa;
        }
      }
      bVar1 = true;
      bVar4 = true;
    }
LAB_002121aa:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&componentOfEquivalentVariable.
                super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&componentOfVariable.
                super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&equivalentVariable.
                super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    uVar6 = uVar6 + 1;
  } while (bVar1 != false);
  bVar4 = false;
  bVar5 = false;
LAB_002121d9:
  PVar2.second = bVar5;
  PVar2.first = bVar4;
  return PVar2;
}

Assistant:

PublicPrivateRequiredPair publicAndOrPrivateInterfaceTypeRequired(const VariablePtr &variable)
{
    PublicPrivateRequiredPair pair = std::make_pair(false, false);
    for (size_t index = 0; index < variable->equivalentVariableCount() && !(pair.first && pair.second); ++index) {
        auto equivalentVariable = variable->equivalentVariable(index);
        auto componentOfVariable = variable->parent();
        auto componentOfEquivalentVariable = equivalentVariable->parent();
        if (componentOfEquivalentVariable == nullptr) {
            return std::make_pair(false, false);
        }
        if (areEntitiesSiblings(componentOfVariable, componentOfEquivalentVariable)
            || isEntityChildOf(componentOfVariable, componentOfEquivalentVariable)) {
            pair.first = true;
        } else if (isEntityChildOf(componentOfEquivalentVariable, componentOfVariable)) {
            pair.second = true;
        } else {
            return std::make_pair(false, false);
        }
    }
    return pair;
}